

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void windowReturnOneRow(WindowCodeArg *p)

{
  int iVar1;
  Parse *pParse_00;
  Window *pMWin;
  Vdbe *p_00;
  FuncDef *pFVar2;
  char *pcVar3;
  Window *pWVar4;
  byte bVar5;
  KeyInfo *p_01;
  int *piVar6;
  int iVar7;
  Op *pOVar8;
  int p1;
  int iVar9;
  int iVar10;
  int op;
  int p3;
  int iVar11;
  int iVar12;
  Parse *pParse;
  int local_6c;
  int local_68;
  int local_54;
  int local_48;
  
  pParse_00 = p->pParse;
  pMWin = p->pMWin;
  p_00 = p->pVdbe;
  pWVar4 = pMWin;
  if (pMWin->regStartRowid == 0) {
    for (; pWVar4 != (Window *)0x0; pWVar4 = pWVar4->pNextWin) {
      pFVar2 = pWVar4->pFunc;
      pcVar3 = pFVar2->zName;
      if (pcVar3 == "nth_value" || pcVar3 == "first_value") {
        iVar11 = pWVar4->csrApp;
        iVar10 = pParse_00->nLabel + -1;
        pParse_00->nLabel = iVar10;
        if (pParse_00->nTempReg == '\0') {
          iVar12 = pParse_00->nMem + 1;
          pParse_00->nMem = iVar12;
        }
        else {
          bVar5 = pParse_00->nTempReg - 1;
          pParse_00->nTempReg = bVar5;
          iVar12 = pParse_00->aTempReg[bVar5];
        }
        sqlite3VdbeAddOp3(p_00,0x49,0,pWVar4->regResult,0);
        if (pFVar2->zName == "nth_value") {
          sqlite3VdbeAddOp3(p_00,0x5a,pMWin->iEphCsr,pWVar4->iArgCol + 1,iVar12);
          windowCheckValue(pParse_00,iVar12,2);
        }
        else {
          sqlite3VdbeAddOp3(p_00,0x46,1,iVar12,0);
        }
        sqlite3VdbeAddOp3(p_00,100,iVar12,pWVar4->regApp,iVar12);
        sqlite3VdbeAddOp3(p_00,0x36,pWVar4->regApp + 1,iVar10,iVar12);
        sqlite3VdbeAddOp3(p_00,0x1e,iVar11,0,iVar12);
        sqlite3VdbeAddOp3(p_00,0x5a,iVar11,pWVar4->iArgCol,pWVar4->regResult);
        sqlite3VdbeResolveLabel(p_00,iVar10);
        if (iVar12 != 0) {
          bVar5 = pParse_00->nTempReg;
joined_r0x0018a147:
          if (bVar5 < 8) {
            pParse_00->nTempReg = bVar5 + 1;
            pParse_00->aTempReg[bVar5] = iVar12;
          }
        }
      }
      else if (pcVar3 == "lead" || pcVar3 == "lag") {
        iVar11 = ((pWVar4->pOwner->x).pList)->nExpr;
        iVar10 = pWVar4->csrApp;
        iVar7 = pParse_00->nLabel + -1;
        pParse_00->nLabel = iVar7;
        if (pParse_00->nTempReg == '\0') {
          iVar12 = pParse_00->nMem + 1;
          pParse_00->nMem = iVar12;
        }
        else {
          bVar5 = pParse_00->nTempReg - 1;
          pParse_00->nTempReg = bVar5;
          iVar12 = pParse_00->aTempReg[bVar5];
        }
        iVar1 = pMWin->iEphCsr;
        if (iVar11 < 3) {
          iVar9 = pWVar4->regResult;
          op = 0x49;
          p3 = 0;
          p1 = 0;
        }
        else {
          p3 = pWVar4->regResult;
          iVar9 = pWVar4->iArgCol + 2;
          op = 0x5a;
          p1 = iVar1;
        }
        sqlite3VdbeAddOp3(p_00,op,p1,iVar9,p3);
        sqlite3VdbeAddOp3(p_00,0x80,iVar1,iVar12,0);
        pcVar3 = pFVar2->zName;
        if (iVar11 < 2) {
          sqlite3VdbeAddOp3(p_00,0x53,iVar12,((pcVar3 == "lead") - 1) + (uint)(pcVar3 == "lead"),0);
        }
        else {
          if (pParse_00->nTempReg == '\0') {
            iVar11 = pParse_00->nMem + 1;
            pParse_00->nMem = iVar11;
          }
          else {
            bVar5 = pParse_00->nTempReg - 1;
            pParse_00->nTempReg = bVar5;
            iVar11 = pParse_00->aTempReg[bVar5];
          }
          sqlite3VdbeAddOp3(p_00,0x5a,iVar1,pWVar4->iArgCol + 1,iVar11);
          sqlite3VdbeAddOp3(p_00,pcVar3 == "lead" ^ 0x65,iVar11,iVar12,iVar12);
          if (iVar11 != 0) {
            bVar5 = pParse_00->nTempReg;
            if ((ulong)bVar5 < 8) {
              pParse_00->nTempReg = bVar5 + 1;
              pParse_00->aTempReg[bVar5] = iVar11;
            }
          }
        }
        sqlite3VdbeAddOp3(p_00,0x1e,iVar10,iVar7,iVar12);
        sqlite3VdbeAddOp3(p_00,0x5a,iVar10,pWVar4->iArgCol,pWVar4->regResult);
        sqlite3VdbeResolveLabel(p_00,iVar7);
        if (iVar12 != 0) {
          bVar5 = pParse_00->nTempReg;
          goto joined_r0x0018a147;
        }
      }
    }
    goto LAB_0018a59e;
  }
  if (pMWin->pOrderBy == (ExprList *)0x0) {
    iVar11 = 0;
  }
  else {
    iVar11 = pMWin->pOrderBy->nExpr;
  }
  iVar7 = pMWin->csrApp;
  iVar12 = pParse_00->nLabel;
  iVar10 = iVar12 + -2;
  pParse_00->nLabel = iVar10;
  if (pParse_00->nTempReg == '\0') {
    local_6c = pParse_00->nMem + 1;
    pParse_00->nMem = local_6c;
  }
  else {
    bVar5 = pParse_00->nTempReg - 1;
    pParse_00->nTempReg = bVar5;
    local_6c = pParse_00->aTempReg[bVar5];
  }
  if (pParse_00->nTempReg == '\0') {
    local_48 = pParse_00->nMem + 1;
    pParse_00->nMem = local_48;
  }
  else {
    bVar5 = pParse_00->nTempReg - 1;
    pParse_00->nTempReg = bVar5;
    local_48 = pParse_00->aTempReg[bVar5];
  }
  if (iVar11 == 0) {
    local_54 = 0;
    local_68 = 0;
  }
  else {
    local_68 = sqlite3GetTempRange(pParse_00,iVar11);
    local_54 = sqlite3GetTempRange(pParse_00,iVar11);
  }
  sqlite3VdbeAddOp3(p_00,0x80,pMWin->iEphCsr,local_6c,0);
  windowReadPeerValues(p,pMWin->iEphCsr,local_68);
  for (; pWVar4 != (Window *)0x0; pWVar4 = pWVar4->pNextWin) {
    sqlite3VdbeAddOp3(p_00,0x49,0,pWVar4->regAccum,0);
  }
  iVar12 = iVar12 + -1;
  sqlite3VdbeAddOp3(p_00,0x18,iVar7,iVar10,pMWin->regStartRowid);
  iVar1 = p_00->nOp;
  sqlite3VdbeAddOp3(p_00,0x80,iVar7,local_48,0);
  sqlite3VdbeAddOp3(p_00,0x36,pMWin->regEndRowid,iVar10,local_48);
  if (pMWin->eExclude != 'B') {
    if (pMWin->eExclude == 'R') {
      sqlite3VdbeAddOp3(p_00,0x35,local_6c,iVar12,local_48);
    }
    else {
      iVar10 = 0;
      if (pMWin->pOrderBy == (ExprList *)0x0) {
        p_01 = (KeyInfo *)0x0;
      }
      else {
        p_01 = sqlite3KeyInfoFromExprList(pParse_00,pMWin->pOrderBy,0,0);
      }
      if (pMWin->eExclude == '[') {
        iVar10 = sqlite3VdbeAddOp3(p_00,0x35,local_6c,0,local_48);
      }
      if (p_01 == (KeyInfo *)0x0) {
        sqlite3VdbeAddOp3(p_00,0xb,0,iVar12,0);
      }
      else {
        windowReadPeerValues(p,iVar7,local_54);
        sqlite3VdbeAddOp3(p_00,0x57,local_54,local_68,iVar11);
        if (p_00->db->mallocFailed == '\0') {
          pOVar8 = p_00->aOp;
          iVar9 = p_00->nOp;
          pOVar8[(long)iVar9 + -1].p4type = -9;
          pOVar8[(long)iVar9 + -1].p4.pKeyInfo = p_01;
        }
        else if ((p_00->db->pnBytesFreed == (int *)0x0) &&
                (p_01->nRef = p_01->nRef - 1, p_01->nRef == 0)) {
          sqlite3DbFreeNN(p_01->db,p_01);
        }
        iVar9 = p_00->nOp + 1;
        sqlite3VdbeAddOp3(p_00,0x10,iVar9,iVar12,iVar9);
      }
      if (iVar10 != 0) {
        if (p_00->db->mallocFailed == '\0') {
          iVar9 = p_00->nOp + -1;
          if (-1 < iVar10) {
            iVar9 = iVar10;
          }
          pOVar8 = p_00->aOp + iVar9;
        }
        else {
          pOVar8 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar8->p2 = p_00->nOp;
      }
    }
  }
  windowAggStep(pParse_00,pMWin,iVar7,0,p->regArg);
  sqlite3VdbeResolveLabel(p_00,iVar12);
  sqlite3VdbeAddOp3(p_00,5,iVar7,iVar1,0);
  iVar10 = p_00->nOp;
  if (p_00->db->mallocFailed == '\0') {
    iVar7 = iVar1;
    if (iVar1 < 1) {
      iVar7 = iVar10;
    }
    pOVar8 = p_00->aOp;
    iVar12 = iVar10 + -1;
    if (-2 < iVar1) {
      iVar12 = iVar1 + 1;
    }
    pOVar8[(long)iVar7 + -1].p2 = iVar10;
    pOVar8 = pOVar8 + iVar12;
  }
  else {
    pOVar8 = (Op *)&sqlite3VdbeGetOp_dummy;
    DAT_00210a70 = iVar10;
  }
  pOVar8->p2 = iVar10;
  if (local_48 != 0) {
    bVar5 = pParse_00->nTempReg;
    if ((ulong)bVar5 < 8) {
      pParse_00->nTempReg = bVar5 + 1;
      pParse_00->aTempReg[bVar5] = local_48;
    }
  }
  if (local_6c != 0) {
    bVar5 = pParse_00->nTempReg;
    if ((ulong)bVar5 < 8) {
      pParse_00->nTempReg = bVar5 + 1;
      pParse_00->aTempReg[bVar5] = local_6c;
    }
  }
  if (iVar11 != 0) {
    if (iVar11 == 1) {
      if (local_54 != 0) {
        bVar5 = pParse_00->nTempReg;
        if ((ulong)bVar5 < 8) {
          pParse_00->nTempReg = bVar5 + 1;
          piVar6 = pParse_00->aTempReg + bVar5;
          goto LAB_0018a550;
        }
      }
    }
    else if (pParse_00->nRangeReg < iVar11) {
      pParse_00->nRangeReg = iVar11;
      piVar6 = &pParse_00->iRangeReg;
LAB_0018a550:
      *piVar6 = local_54;
    }
    if (iVar11 == 1) {
      if (local_68 != 0) {
        bVar5 = pParse_00->nTempReg;
        if ((ulong)bVar5 < 8) {
          pParse_00->nTempReg = bVar5 + 1;
          piVar6 = pParse_00->aTempReg + bVar5;
          goto LAB_0018a58b;
        }
      }
    }
    else if (pParse_00->nRangeReg < iVar11) {
      pParse_00->nRangeReg = iVar11;
      piVar6 = &pParse_00->iRangeReg;
LAB_0018a58b:
      *piVar6 = local_68;
    }
  }
  windowAggFinal(p,1);
LAB_0018a59e:
  sqlite3VdbeAddOp3(p_00,0xc,p->regGosub,p->addrGosub,0);
  return;
}

Assistant:

static void windowReturnOneRow(WindowCodeArg *p){
  Window *pMWin = p->pMWin;
  Vdbe *v = p->pVdbe;

  if( pMWin->regStartRowid ){
    windowFullScan(p);
  }else{
    Parse *pParse = p->pParse;
    Window *pWin;

    for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
      FuncDef *pFunc = pWin->pFunc;
      if( pFunc->zName==nth_valueName
       || pFunc->zName==first_valueName
      ){
        int csr = pWin->csrApp;
        int lbl = sqlite3VdbeMakeLabel(pParse);
        int tmpReg = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);
  
        if( pFunc->zName==nth_valueName ){
          sqlite3VdbeAddOp3(v, OP_Column,pMWin->iEphCsr,pWin->iArgCol+1,tmpReg);
          windowCheckValue(pParse, tmpReg, 2);
        }else{
          sqlite3VdbeAddOp2(v, OP_Integer, 1, tmpReg);
        }
        sqlite3VdbeAddOp3(v, OP_Add, tmpReg, pWin->regApp, tmpReg);
        sqlite3VdbeAddOp3(v, OP_Gt, pWin->regApp+1, lbl, tmpReg);
        VdbeCoverageNeverNull(v);
        sqlite3VdbeAddOp3(v, OP_SeekRowid, csr, 0, tmpReg);
        VdbeCoverageNeverTaken(v);
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol, pWin->regResult);
        sqlite3VdbeResolveLabel(v, lbl);
        sqlite3ReleaseTempReg(pParse, tmpReg);
      }
      else if( pFunc->zName==leadName || pFunc->zName==lagName ){
        int nArg = pWin->pOwner->x.pList->nExpr;
        int csr = pWin->csrApp;
        int lbl = sqlite3VdbeMakeLabel(pParse);
        int tmpReg = sqlite3GetTempReg(pParse);
        int iEph = pMWin->iEphCsr;
  
        if( nArg<3 ){
          sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);
        }else{
          sqlite3VdbeAddOp3(v, OP_Column, iEph,pWin->iArgCol+2,pWin->regResult);
        }
        sqlite3VdbeAddOp2(v, OP_Rowid, iEph, tmpReg);
        if( nArg<2 ){
          int val = (pFunc->zName==leadName ? 1 : -1);
          sqlite3VdbeAddOp2(v, OP_AddImm, tmpReg, val);
        }else{
          int op = (pFunc->zName==leadName ? OP_Add : OP_Subtract);
          int tmpReg2 = sqlite3GetTempReg(pParse);
          sqlite3VdbeAddOp3(v, OP_Column, iEph, pWin->iArgCol+1, tmpReg2);
          sqlite3VdbeAddOp3(v, op, tmpReg2, tmpReg, tmpReg);
          sqlite3ReleaseTempReg(pParse, tmpReg2);
        }
  
        sqlite3VdbeAddOp3(v, OP_SeekRowid, csr, lbl, tmpReg);
        VdbeCoverage(v);
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol, pWin->regResult);
        sqlite3VdbeResolveLabel(v, lbl);
        sqlite3ReleaseTempReg(pParse, tmpReg);
      }
    }
  }
  sqlite3VdbeAddOp2(v, OP_Gosub, p->regGosub, p->addrGosub);
}